

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.h
# Opt level: O0

int loop(sockaddr_in *address)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  int *piVar6;
  time_t tVar7;
  long lVar8;
  uint32_t *puVar9;
  ulong uVar10;
  socklen_t in_ECX;
  sockaddr *__addr;
  size_t __nbytes;
  double dVar11;
  byte local_1c3;
  undefined1 local_1a0 [8];
  string response;
  undefined1 local_178 [4];
  uint32_t msgLength;
  string msgLengthBuffer;
  time_t currentTime;
  string local_148;
  allocator<char> local_121;
  string local_120;
  uint local_100;
  int local_fc;
  int key;
  int events;
  timeval timeout;
  fd_set *__arr;
  undefined1 auStack_d8 [4];
  uint __i;
  fd_set fdset;
  undefined1 local_40 [8];
  Connection connection;
  sockaddr_in *address_local;
  
  connection._32_8_ = address;
  std::__cxx11::string::operator=((string *)cc::dest_abi_cxx11_,"");
  if ((s_verbose & 1U) != 0) {
    puts("Opening connection");
  }
  Connection::Connection((Connection *)local_40);
  uVar3 = Connection::connect((Connection *)local_40,connection.fd,__addr,in_ECX);
  if ((uVar3 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to connect to ");
    pcVar5 = inet_ntoa((in_addr)*(in_addr_t *)(connection._32_8_ + 4));
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    piVar6 = __errno_location();
    address_local._4_4_ = *piVar6;
    fdset.fds_bits[0xf]._4_4_ = 1;
  }
  else {
    if ((s_verbose & 1U) != 0) {
      puts("Sending connection message");
    }
    bVar2 = cc::sendSimple((Connection *)local_40,Connect,Connection);
    if (bVar2) {
      puts("Connected");
      bVar2 = cc::sendSimple((Connection *)local_40,GetStatus,Receiver);
      if (bVar2) {
        s_lastPing = time((time_t *)0x0);
        do {
          do {
            do {
              local_1c3 = 0;
              if ((s_running & 1U) != 0) {
                local_1c3 = local_40[0] ^ 0xff;
              }
              if ((local_1c3 & 1) == 0) {
                address_local._4_4_ = 0;
                fdset.fds_bits[0xf]._4_4_ = 1;
                goto LAB_0010a92d;
              }
              timeout.tv_usec = (__suseconds_t)auStack_d8;
              for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
                *(undefined8 *)(timeout.tv_usec + (ulong)__arr._4_4_ * 8) = 0;
              }
              iVar1 = (int)connection.handle;
              if ((int)connection.handle < 0) {
                iVar1 = (int)connection.handle + 0x3f;
              }
              *(ulong *)(auStack_d8 + (long)(iVar1 >> 6) * 8) =
                   *(ulong *)(auStack_d8 + (long)(iVar1 >> 6) * 8) |
                   1L << ((ulong)(byte)(int)connection.handle & 0x3f);
              auStack_d8[0] = auStack_d8[0] | 1;
              _key = 1;
              timeout.tv_sec = 0;
              local_fc = select((int)connection.handle + 1,(fd_set *)auStack_d8,(fd_set *)0x0,
                                (fd_set *)0x0,(timeval *)&key);
              dVar11 = currentPosition();
              printProgress(dVar11,currentDuration);
              if (local_fc < 0) {
                perror("select()");
                piVar6 = __errno_location();
                address_local._4_4_ = *piVar6;
                fdset.fds_bits[0xf]._4_4_ = 1;
                goto LAB_0010a92d;
              }
              piVar6 = __errno_location();
            } while (*piVar6 == 4);
            if ((auStack_d8[0] & 1) != 0) {
              local_100 = getchar();
              if (local_100 == 0x1b) {
LAB_0010a250:
                s_running = false;
                address_local._4_4_ = 0;
                fdset.fds_bits[0xf]._4_4_ = 1;
                goto LAB_0010a92d;
              }
              if (local_100 == 0x20) {
                bVar2 = std::operator==(&s_currentStatus_abi_cxx11_,"PLAYING");
                if (bVar2) {
                  puts("Pausing");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_120,"PAUSE",&local_121);
                  cc::sendSimpleMedia((Connection *)local_40,&local_120);
                  std::__cxx11::string::~string((string *)&local_120);
                  std::allocator<char>::~allocator(&local_121);
                }
                else {
                  bVar2 = std::operator==(&s_currentStatus_abi_cxx11_,"PAUSED");
                  if (bVar2) {
                    puts("Resuming playback");
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_148,"PLAY",
                               (allocator<char> *)((long)&currentTime + 7));
                    cc::sendSimpleMedia((Connection *)local_40,&local_148);
                    std::__cxx11::string::~string((string *)&local_148);
                    std::allocator<char>::~allocator((allocator<char> *)((long)&currentTime + 7));
                  }
                }
              }
              else {
                if (local_100 == 0x71) goto LAB_0010a250;
                if ((s_verbose & 1U) != 0) {
                  printf("Unhandled key 0x%x\n",(ulong)local_100);
                }
              }
            }
            dVar11 = nextSegmentStart;
            if (local_fc == 0) {
              if ((0.0 < nextSegmentStart) && (tVar7 = time((time_t *)0x0), dVar11 <= (double)tVar7)
                 ) {
                nextSegmentStart = -1.0;
                cc::sendSimple((Connection *)local_40,GetStatus,Media);
              }
              msgLengthBuffer.field_2._8_8_ = time((time_t *)0x0);
              if (0x1e < msgLengthBuffer.field_2._8_8_ - s_lastPing) {
                if ((s_verbose & 1U) != 0) {
                  poVar4 = std::operator<<((ostream *)&std::cout,"Sending ping, last ping: ");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,s_lastPing);
                  poVar4 = std::operator<<(poVar4," current time: ");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,msgLengthBuffer.field_2._8_8_)
                  ;
                  poVar4 = std::operator<<(poVar4," delta: ");
                  poVar4 = (ostream *)
                           std::ostream::operator<<
                                     (poVar4,msgLengthBuffer.field_2._8_8_ - s_lastPing);
                  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                }
                bVar2 = cc::sendSimple((Connection *)local_40,Ping,Heartbeat);
                if (!bVar2) {
                  puts("Failed to send ping, assuming disconnected");
                  address_local._4_4_ = 0x6e;
                  fdset.fds_bits[0xf]._4_4_ = 1;
                  goto LAB_0010a92d;
                }
                s_lastPing = time((time_t *)0x0);
              }
            }
            __nbytes = 1L << ((byte)((long)(int)connection.handle % 0x40) & 0x3f);
          } while ((*(ulong *)(auStack_d8 + (long)((int)connection.handle / 0x40) * 8) & __nbytes)
                   == 0);
          Connection::read_abi_cxx11_((Connection *)local_178,(int)local_40,(void *)0x4,__nbytes);
          lVar8 = std::__cxx11::string::size();
          if (lVar8 == 4) {
            if ((local_40[0] & 1U) == 0) {
              response.field_2._12_4_ = 0;
              puVar9 = (uint32_t *)std::__cxx11::string::data();
              response.field_2._12_4_ = *puVar9;
              response.field_2._12_4_ = ntohl(response.field_2._12_4_);
              if ((uint)response.field_2._12_4_ < 0x10001) {
                Connection::read_abi_cxx11_
                          ((Connection *)local_1a0,(int)local_40,
                           (void *)(ulong)(uint)response.field_2._12_4_,__nbytes);
                uVar10 = std::__cxx11::string::size();
                if (uVar10 < (uint)response.field_2._12_4_) {
                  poVar4 = std::operator<<((ostream *)&std::cerr,"Short read, expected ");
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,response.field_2._12_4_);
                  poVar4 = std::operator<<(poVar4," got ");
                  uVar10 = std::__cxx11::string::size();
                  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar10);
                  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                  address_local._4_4_ = 0x4a;
                  fdset.fds_bits[0xf]._4_4_ = 1;
                }
                else {
                  bVar2 = handleMessage((Connection *)local_40,(string *)local_1a0);
                  if (bVar2) {
                    if ((local_40[0] & 1U) == 0) {
                      s_lastPing = time((time_t *)0x0);
                      fdset.fds_bits[0xf]._4_4_ = 0;
                    }
                    else {
                      puts("Disconnected");
                      address_local._4_4_ = 0x68;
                      fdset.fds_bits[0xf]._4_4_ = 1;
                    }
                  }
                  else {
                    puts("Failed to parse message");
                    address_local._4_4_ = 0x68;
                    fdset.fds_bits[0xf]._4_4_ = 1;
                  }
                }
                std::__cxx11::string::~string((string *)local_1a0);
              }
              else {
                printf("Message length out of range: %d\n",(ulong)(uint)response.field_2._12_4_);
                address_local._4_4_ = 0x4a;
                fdset.fds_bits[0xf]._4_4_ = 1;
              }
            }
            else {
              puts("Connection closed");
              address_local._4_4_ = 0x68;
              fdset.fds_bits[0xf]._4_4_ = 1;
            }
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to read message size: \'");
            poVar4 = std::operator<<(poVar4,(string *)local_178);
            poVar4 = std::operator<<(poVar4,"\'");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            address_local._4_4_ = 0x4a;
            fdset.fds_bits[0xf]._4_4_ = 1;
          }
          std::__cxx11::string::~string((string *)local_178);
        } while (fdset.fds_bits[0xf]._4_4_ == 0);
      }
      else {
        puts("Failed to send getstatus message");
        piVar6 = __errno_location();
        address_local._4_4_ = *piVar6;
        fdset.fds_bits[0xf]._4_4_ = 1;
      }
    }
    else {
      puts("Failed to send connect message");
      piVar6 = __errno_location();
      address_local._4_4_ = *piVar6;
      fdset.fds_bits[0xf]._4_4_ = 1;
    }
  }
LAB_0010a92d:
  Connection::~Connection((Connection *)local_40);
  return address_local._4_4_;
}

Assistant:

int loop(const sockaddr_in &address)
{
    cc::dest = "";

    if (s_verbose) {
        puts("Opening connection");
    }
    Connection connection;
    if (!connection.connect(address)) {
        std::cerr << "Failed to connect to " << inet_ntoa(address.sin_addr) << std::endl;
        return errno;
    }
    if (s_verbose) {
        puts("Sending connection message");
    }
    if (!cc::sendSimple(connection, cc::msg::Connect, cc::ns::Connection)) {
        puts("Failed to send connect message");
        return errno;
    }
    puts("Connected");
    if (!cc::sendSimple(connection, cc::msg::GetStatus, cc::ns::Receiver)) {
        puts("Failed to send getstatus message");
        return errno;
    }
    s_lastPing = time(nullptr);

    while (s_running && !connection.eof) {
        fd_set fdset;
        FD_ZERO(&fdset);
        FD_SET(connection.fd, &fdset);
        FD_SET(STDIN_FILENO, &fdset);

        timeval timeout;
        timeout.tv_sec = 1; // max 1 second so we can update the progress bar
        timeout.tv_usec = 0;
        const int events = select(connection.fd + 1, &fdset, 0, 0, &timeout);
        printProgress(currentPosition(), currentDuration);

        if (events < 0) {
            perror("select()");
            return errno;
        }
        if (errno == EINTR) {
            continue;
        }

        if (FD_ISSET(STDIN_FILENO, &fdset)) {
            const int key = getchar();
            switch(key) {
            case 'q':
            case '\x1b':
                s_running = false;
                return 0;
            case ' ':
                if (s_currentStatus == "PLAYING") {
                    puts("Pausing");
                    cc::sendSimpleMedia(connection, "PAUSE");
                } else if (s_currentStatus == "PAUSED") {
                    puts("Resuming playback");
                    cc::sendSimpleMedia(connection, "PLAY");
                }
                break;
            default:
                if (s_verbose) printf("Unhandled key 0x%x\n", key);
                break;
            }
        }

        if (events == 0) { // timeout
            if (nextSegmentStart > 0 && nextSegmentStart <= time(nullptr)) {
                nextSegmentStart = -1;
                // Update to make sure we are in sync before we skip the sponsor
                cc::sendSimple(connection, cc::msg::GetStatus, cc::ns::Media);
            }

            const time_t currentTime = time(nullptr);
            if (currentTime - s_lastPing > PING_INTERVAL) {
                if (s_verbose) {
                    std::cout << "Sending ping, last ping: " << s_lastPing << " current time: " << currentTime << " delta: " << (currentTime - s_lastPing) << std::endl;
                }
                if (!cc::sendSimple(connection, cc::msg::Ping, cc::ns::Heartbeat)) {
                    puts("Failed to send ping, assuming disconnected");
                    return ETIMEDOUT;
                }
                s_lastPing = time(nullptr);
            }
        }

        if (!FD_ISSET(connection.fd, &fdset)) {
            continue;
        }

        std::string msgLengthBuffer = connection.read(sizeof(uint32_t));
        if (msgLengthBuffer.size() != 4) {
            std::cerr << "Failed to read message size: '" << msgLengthBuffer << "'" << std::endl;
            return EBADMSG;
        }
        if (connection.eof) {
            puts("Connection closed");
            return ECONNRESET;
        }
        uint32_t msgLength = 0;
        memcpy(&msgLength, msgLengthBuffer.data(), sizeof msgLength);
        msgLength = ntohl(msgLength);
        if (msgLength > 64 * 1024) { // 64kb max according to the spec
            printf("Message length out of range: %d\n", msgLength);
            return EBADMSG;
        }

        std::string response = connection.read(msgLength);
        if (response.size() < msgLength) {
            std::cerr << "Short read, expected " << msgLength << " got " << response.size() << std::endl;
            return EBADMSG;
        }
        if (!handleMessage(&connection, response)) {
            puts("Failed to parse message");
            return ECONNRESET;
        }
        if (connection.eof) {
            puts("Disconnected");
            return ECONNRESET;
        }

        // We got a valid message
        s_lastPing = time(nullptr);
    }
    return 0;
}